

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void print_code(vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>
                *v,vector<ErrorInfoException,_std::allocator<ErrorInfoException>_> *errors)

{
  pointer psVar1;
  enableStd<rang::fg> pbVar2;
  ostream *os;
  ulong uVar3;
  shared_ptr<StringLine> *it;
  pointer sl;
  __normal_iterator<const_ErrorInfoException_*,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
  eit;
  
  system("clear");
  eit._M_current =
       (errors->super__Vector_base<ErrorInfoException,_std::allocator<ErrorInfoException>_>)._M_impl
       .super__Vector_impl_data._M_start;
  psVar1 = (v->
           super__Vector_base<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (sl = (v->
            super__Vector_base<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>
            )._M_impl.super__Vector_impl_data._M_start; sl != psVar1; sl = sl + 1) {
    pbVar2 = rang::operator<<((ostream *)&std::cout,yellow);
    os = (ostream *)
         std::ostream::operator<<
                   ((ostream *)pbVar2,
                    ((sl->super___shared_ptr<StringLine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->line)
    ;
    pbVar2 = rang::operator<<(os,reset);
    std::operator<<(pbVar2,": ");
    uVar3 = 0;
    while (uVar3 < (((sl->super___shared_ptr<StringLine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->text)
                   ._M_string_length) {
      print_error_color(&eit,errors,sl,(int)(uVar3 + 1));
      std::operator<<((ostream *)&std::cout,
                      (((sl->super___shared_ptr<StringLine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                      text)._M_dataplus._M_p[uVar3]);
      uVar3 = uVar3 + 1;
    }
    reset_error_color(&eit,errors);
  }
  return;
}

Assistant:

void print_code(const vector<shared_ptr<StringLine>> &v, const vector<ErrorInfoException> &errors) {
    system("clear");
    __gnu_cxx::__normal_iterator<const ErrorInfoException *, vector<ErrorInfoException, allocator<ErrorInfoException>>> eit = errors.begin();
    for (const auto &it : v) {
        cout << fg::yellow << it->get_line() << fg::reset << ": ";
        for (int i = 0; i < it->get_text().size(); ++i) {
            int column = i + 1;
            print_error_color(eit, errors, it, column);
            cout << it->get_text()[i];
        }
        reset_error_color(eit, errors);
    }
}